

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngrams_raw.c
# Opt level: O2

int ngram_ord_comparator(void *a_raw,void *b_raw)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  while ((*(uint *)((long)a_raw + 0x10) != uVar3 && (uVar3 < *(uint *)((long)b_raw + 0x10)))) {
    uVar1 = *(uint *)(*a_raw + uVar3 * 4);
    uVar2 = *(uint *)(*b_raw + uVar3 * 4);
    uVar3 = uVar3 + 1;
    if (uVar1 != uVar2) {
      return -(uint)(uVar1 < uVar2) | 1;
    }
  }
  return *(uint *)((long)a_raw + 0x10) - *(uint *)((long)b_raw + 0x10);
}

Assistant:

int
ngram_ord_comparator(const void *a_raw, const void *b_raw)
{
    ngram_raw_t *a = (ngram_raw_t *) a_raw;
    ngram_raw_t *b = (ngram_raw_t *) b_raw;
    int a_w_ptr = 0;
    int b_w_ptr = 0;
    while ((uint32)a_w_ptr < a->order && (uint32)b_w_ptr < b->order) {
        if (a->words[a_w_ptr] == b->words[b_w_ptr]) {
            a_w_ptr++;
            b_w_ptr++;
            continue;
        }
        if (a->words[a_w_ptr] < b->words[b_w_ptr])
            return -1;
        else
            return 1;
    }
    return a->order - b->order;
}